

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

int mz_inflate(mz_streamp pStream,int flush)

{
  uint uVar1;
  tinfl_status tVar2;
  bool bVar3;
  uint local_60;
  uint local_58;
  tinfl_status status;
  size_t orig_avail_in;
  size_t out_bytes;
  size_t in_bytes;
  mz_uint32 local_30;
  mz_uint decomp_flags;
  mz_uint first_call;
  mz_uint n;
  inflate_state *pState;
  mz_streamp pmStack_18;
  int flush_local;
  mz_streamp pStream_local;
  
  in_bytes._4_4_ = 8;
  if ((pStream == (mz_streamp)0x0) || (pStream->state == (mz_internal_state *)0x0)) {
    pStream_local._4_4_ = 0xfffffffe;
  }
  else {
    pState._4_4_ = flush;
    if (flush == 1) {
      pState._4_4_ = 2;
    }
    if (((pState._4_4_ == 0) || (pState._4_4_ == 2)) || (pState._4_4_ == 4)) {
      _first_call = (tinfl_decompressor *)pStream->state;
      if (0 < (int)_first_call[1].m_z_adler32) {
        in_bytes._4_4_ = 9;
      }
      uVar1 = pStream->avail_in;
      local_30 = _first_call[1].m_zhdr0;
      _first_call[1].m_zhdr0 = 0;
      if (*(int *)(_first_call[3].m_len_codes + 0xf8) < 0) {
        pStream_local._4_4_ = 0xfffffffd;
      }
      else if ((_first_call[1].m_zhdr1 == 0) || (pState._4_4_ == 4)) {
        _first_call[1].m_zhdr1 = (uint)(pState._4_4_ == 4) | _first_call[1].m_zhdr1;
        pmStack_18 = pStream;
        if ((pState._4_4_ == 4) && (local_30 != 0)) {
          in_bytes._4_4_ = in_bytes._4_4_ | 4;
          out_bytes = (size_t)pStream->avail_in;
          orig_avail_in = (size_t)pStream->avail_out;
          tVar2 = tinfl_decompress(_first_call,pStream->next_in,&out_bytes,pStream->next_out,
                                   pStream->next_out,&orig_avail_in,in_bytes._4_4_);
          *(tinfl_status *)(_first_call[3].m_len_codes + 0xf8) = tVar2;
          pmStack_18->next_in = pmStack_18->next_in + (out_bytes & 0xffffffff);
          pmStack_18->avail_in = pmStack_18->avail_in - (int)out_bytes;
          pmStack_18->total_in = (out_bytes & 0xffffffff) + pmStack_18->total_in;
          pmStack_18->adler = (ulong)_first_call->m_check_adler32;
          pmStack_18->next_out = pmStack_18->next_out + (orig_avail_in & 0xffffffff);
          pmStack_18->avail_out = pmStack_18->avail_out - (int)orig_avail_in;
          pmStack_18->total_out = (orig_avail_in & 0xffffffff) + pmStack_18->total_out;
          if (tVar2 < TINFL_STATUS_DONE) {
            pStream_local._4_4_ = 0xfffffffd;
          }
          else if (tVar2 == TINFL_STATUS_DONE) {
            pStream_local._4_4_ = 1;
          }
          else {
            _first_call[3].m_len_codes[0xf8] = 0xff;
            _first_call[3].m_len_codes[0xf9] = 0xff;
            _first_call[3].m_len_codes[0xfa] = 0xff;
            _first_call[3].m_len_codes[0xfb] = 0xff;
            pStream_local._4_4_ = 0xfffffffb;
          }
        }
        else {
          if (pState._4_4_ != 4) {
            in_bytes._4_4_ = in_bytes._4_4_ | 2;
          }
          if (_first_call[1].m_num_bits == 0) {
            do {
              while( true ) {
                out_bytes = (size_t)pmStack_18->avail_in;
                orig_avail_in = (size_t)(0x8000 - _first_call[1].m_state);
                tVar2 = tinfl_decompress(_first_call,pmStack_18->next_in,&out_bytes,
                                         (mz_uint8 *)&_first_call[1].m_final,
                                         (mz_uint8 *)
                                         ((long)_first_call[1].m_table_sizes +
                                         ((ulong)_first_call[1].m_state - 0x18)),&orig_avail_in,
                                         in_bytes._4_4_);
                *(tinfl_status *)(_first_call[3].m_len_codes + 0xf8) = tVar2;
                pmStack_18->next_in = pmStack_18->next_in + (out_bytes & 0xffffffff);
                pmStack_18->avail_in = pmStack_18->avail_in - (int)out_bytes;
                pmStack_18->total_in = (out_bytes & 0xffffffff) + pmStack_18->total_in;
                pmStack_18->adler = (ulong)_first_call->m_check_adler32;
                _first_call[1].m_num_bits = (mz_uint32)orig_avail_in;
                if (_first_call[1].m_num_bits < pmStack_18->avail_out) {
                  local_60 = _first_call[1].m_num_bits;
                }
                else {
                  local_60 = pmStack_18->avail_out;
                }
                decomp_flags = local_60;
                memcpy(pmStack_18->next_out,
                       (void *)((long)_first_call[1].m_table_sizes +
                               ((ulong)_first_call[1].m_state - 0x18)),(ulong)local_60);
                pmStack_18->next_out = pmStack_18->next_out + decomp_flags;
                pmStack_18->avail_out = pmStack_18->avail_out - decomp_flags;
                pmStack_18->total_out = (ulong)decomp_flags + pmStack_18->total_out;
                _first_call[1].m_num_bits = _first_call[1].m_num_bits - decomp_flags;
                _first_call[1].m_state = _first_call[1].m_state + decomp_flags & 0x7fff;
                if (tVar2 < TINFL_STATUS_DONE) {
                  return -3;
                }
                if ((tVar2 == TINFL_STATUS_NEEDS_MORE_INPUT) && (uVar1 == 0)) {
                  return -5;
                }
                if (pState._4_4_ != 4) break;
                if (tVar2 == TINFL_STATUS_DONE) {
                  if (_first_call[1].m_num_bits == 0) {
                    return 1;
                  }
                  return -5;
                }
                if (pmStack_18->avail_out == 0) {
                  return -5;
                }
              }
            } while ((((tVar2 != TINFL_STATUS_DONE) && (pmStack_18->avail_in != 0)) &&
                     (pmStack_18->avail_out != 0)) && (_first_call[1].m_num_bits == 0));
            bVar3 = false;
            if (tVar2 == TINFL_STATUS_DONE) {
              bVar3 = _first_call[1].m_num_bits == 0;
            }
            pStream_local._4_4_ = (uint)bVar3;
          }
          else {
            if (_first_call[1].m_num_bits < pStream->avail_out) {
              local_58 = _first_call[1].m_num_bits;
            }
            else {
              local_58 = pStream->avail_out;
            }
            decomp_flags = local_58;
            memcpy(pStream->next_out,
                   (void *)((long)_first_call[1].m_table_sizes +
                           ((ulong)_first_call[1].m_state - 0x18)),(ulong)local_58);
            pmStack_18->next_out = pmStack_18->next_out + decomp_flags;
            pmStack_18->avail_out = pmStack_18->avail_out - decomp_flags;
            pmStack_18->total_out = (ulong)decomp_flags + pmStack_18->total_out;
            _first_call[1].m_num_bits = _first_call[1].m_num_bits - decomp_flags;
            _first_call[1].m_state = _first_call[1].m_state + decomp_flags & 0x7fff;
            bVar3 = false;
            if (*(int *)(_first_call[3].m_len_codes + 0xf8) == 0) {
              bVar3 = _first_call[1].m_num_bits == 0;
            }
            pStream_local._4_4_ = (uint)bVar3;
          }
        }
      }
      else {
        pStream_local._4_4_ = 0xfffffffe;
      }
    }
    else {
      pStream_local._4_4_ = 0xfffffffe;
    }
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_inflate(mz_streamp pStream, int flush)
{
    inflate_state *pState;
    mz_uint n, first_call, decomp_flags = TINFL_FLAG_COMPUTE_ADLER32;
    size_t in_bytes, out_bytes, orig_avail_in;
    tinfl_status status;

    if ((!pStream) || (!pStream->state))
        return MZ_STREAM_ERROR;
    if (flush == MZ_PARTIAL_FLUSH)
        flush = MZ_SYNC_FLUSH;
    if ((flush) && (flush != MZ_SYNC_FLUSH) && (flush != MZ_FINISH))
        return MZ_STREAM_ERROR;

    pState = (inflate_state *)pStream->state;
    if (pState->m_window_bits > 0)
        decomp_flags |= TINFL_FLAG_PARSE_ZLIB_HEADER;
    orig_avail_in = pStream->avail_in;

    first_call = pState->m_first_call;
    pState->m_first_call = 0;
    if (pState->m_last_status < 0)
        return MZ_DATA_ERROR;

    if (pState->m_has_flushed && (flush != MZ_FINISH))
        return MZ_STREAM_ERROR;
    pState->m_has_flushed |= (flush == MZ_FINISH);

    if ((flush == MZ_FINISH) && (first_call))
    {
        /* MZ_FINISH on the first call implies that the input and output buffers are large enough to hold the entire compressed/decompressed file. */
        decomp_flags |= TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF;
        in_bytes = pStream->avail_in;
        out_bytes = pStream->avail_out;
        status = tinfl_decompress(&pState->m_decomp, pStream->next_in, &in_bytes, pStream->next_out, pStream->next_out, &out_bytes, decomp_flags);
        pState->m_last_status = status;
        pStream->next_in += (mz_uint)in_bytes;
        pStream->avail_in -= (mz_uint)in_bytes;
        pStream->total_in += (mz_uint)in_bytes;
        pStream->adler = tinfl_get_adler32(&pState->m_decomp);
        pStream->next_out += (mz_uint)out_bytes;
        pStream->avail_out -= (mz_uint)out_bytes;
        pStream->total_out += (mz_uint)out_bytes;

        if (status < 0)
            return MZ_DATA_ERROR;
        else if (status != TINFL_STATUS_DONE)
        {
            pState->m_last_status = TINFL_STATUS_FAILED;
            return MZ_BUF_ERROR;
        }
        return MZ_STREAM_END;
    }
    /* flush != MZ_FINISH then we must assume there's more input. */
    if (flush != MZ_FINISH)
        decomp_flags |= TINFL_FLAG_HAS_MORE_INPUT;

    if (pState->m_dict_avail)
    {
        n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
        memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
        pStream->next_out += n;
        pStream->avail_out -= n;
        pStream->total_out += n;
        pState->m_dict_avail -= n;
        pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);
        return ((pState->m_last_status == TINFL_STATUS_DONE) && (!pState->m_dict_avail)) ? MZ_STREAM_END : MZ_OK;
    }

    for (;;)
    {
        in_bytes = pStream->avail_in;
        out_bytes = TINFL_LZ_DICT_SIZE - pState->m_dict_ofs;

        status = tinfl_decompress(&pState->m_decomp, pStream->next_in, &in_bytes, pState->m_dict, pState->m_dict + pState->m_dict_ofs, &out_bytes, decomp_flags);
        pState->m_last_status = status;

        pStream->next_in += (mz_uint)in_bytes;
        pStream->avail_in -= (mz_uint)in_bytes;
        pStream->total_in += (mz_uint)in_bytes;
        pStream->adler = tinfl_get_adler32(&pState->m_decomp);

        pState->m_dict_avail = (mz_uint)out_bytes;

        n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
        memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
        pStream->next_out += n;
        pStream->avail_out -= n;
        pStream->total_out += n;
        pState->m_dict_avail -= n;
        pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);

        if (status < 0)
            return MZ_DATA_ERROR; /* Stream is corrupted (there could be some uncompressed data left in the output dictionary - oh well). */
        else if ((status == TINFL_STATUS_NEEDS_MORE_INPUT) && (!orig_avail_in))
            return MZ_BUF_ERROR; /* Signal caller that we can't make forward progress without supplying more input or by setting flush to MZ_FINISH. */
        else if (flush == MZ_FINISH)
        {
            /* The output buffer MUST be large to hold the remaining uncompressed data when flush==MZ_FINISH. */
            if (status == TINFL_STATUS_DONE)
                return pState->m_dict_avail ? MZ_BUF_ERROR : MZ_STREAM_END;
            /* status here must be TINFL_STATUS_HAS_MORE_OUTPUT, which means there's at least 1 more byte on the way. If there's no more room left in the output buffer then something is wrong. */
            else if (!pStream->avail_out)
                return MZ_BUF_ERROR;
        }
        else if ((status == TINFL_STATUS_DONE) || (!pStream->avail_in) || (!pStream->avail_out) || (pState->m_dict_avail))
            break;
    }

    return ((status == TINFL_STATUS_DONE) && (!pState->m_dict_avail)) ? MZ_STREAM_END : MZ_OK;
}